

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TokenStream * __thiscall Catch::clara::detail::TokenStream::operator++(TokenStream *this)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<Catch::clara::detail::Token_*,_std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>_>
  local_20;
  const_iterator local_18;
  TokenStream *local_10;
  TokenStream *this_local;
  
  local_10 = this;
  sVar2 = std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          size(&this->m_tokenBuffer);
  if (sVar2 < 2) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&this->it,&this->itEnd);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&this->it);
    }
    loadBuffer(this);
  }
  else {
    local_20._M_current =
         (Token *)std::
                  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  ::begin(&this->m_tokenBuffer);
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::Token_const*,std::vector<Catch::clara::detail::Token,std::allocator<Catch::clara::detail::Token>>>
    ::__normal_iterator<Catch::clara::detail::Token*>
              ((__normal_iterator<Catch::clara::detail::Token_const*,std::vector<Catch::clara::detail::Token,std::allocator<Catch::clara::detail::Token>>>
                *)&local_18,&local_20);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::erase
              (&this->m_tokenBuffer,local_18);
  }
  return this;
}

Assistant:

auto operator++() -> TokenStream & {
            if( m_tokenBuffer.size() >= 2 ) {
                m_tokenBuffer.erase( m_tokenBuffer.begin() );
            } else {
                if( it != itEnd )
                    ++it;
                loadBuffer();
            }
            return *this;
        }